

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  uint __line;
  char *__assertion;
  scale loaded_scale;
  ifstream test_scale;
  
  std::ifstream::ifstream(&test_scale);
  std::ifstream::open((char *)&test_scale,0x127020);
  scala::read_scl(&loaded_scale,&test_scale);
  if ((long)loaded_scale.degrees.super__Vector_base<scala::degree,_std::allocator<scala::degree>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)loaded_scale.degrees.super__Vector_base<scala::degree,_std::allocator<scala::degree>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x18) {
    if (((loaded_scale.degrees.super__Vector_base<scala::degree,_std::allocator<scala::degree>_>.
          _M_impl.super__Vector_impl_data._M_start)->ratio != 1.0) ||
       (NAN((loaded_scale.degrees.super__Vector_base<scala::degree,_std::allocator<scala::degree>_>.
             _M_impl.super__Vector_impl_data._M_start)->ratio))) {
      __assertion = "loaded_scale.get_ratio(0) == 1";
      __line = 0x14;
    }
    else if ((loaded_scale.degrees.super__Vector_base<scala::degree,_std::allocator<scala::degree>_>
              ._M_impl.super__Vector_impl_data._M_start[1].ratio != 1.122462048309373) ||
            (NAN(loaded_scale.degrees.
                 super__Vector_base<scala::degree,_std::allocator<scala::degree>_>._M_impl.
                 super__Vector_impl_data._M_start[1].ratio))) {
      __assertion = "loaded_scale.get_ratio(1) == pow(2.0, 1.0/6.0)";
      __line = 0x15;
    }
    else {
      if ((loaded_scale.degrees.super__Vector_base<scala::degree,_std::allocator<scala::degree>_>.
           _M_impl.super__Vector_impl_data._M_start[2].ratio == 2.0) &&
         (!NAN(loaded_scale.degrees.
               super__Vector_base<scala::degree,_std::allocator<scala::degree>_>._M_impl.
               super__Vector_impl_data._M_start[2].ratio))) {
        std::ifstream::close();
        scala::scale::~scale(&loaded_scale);
        std::ifstream::~ifstream(&test_scale);
        return 0;
      }
      __assertion = "loaded_scale.get_ratio(2) == 2";
      __line = 0x16;
    }
  }
  else {
    __assertion = "loaded_scale.get_scale_length() == 3";
    __line = 0x13;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/mixed.cpp"
                ,__line,"int main(int, char **)");
}

Assistant:

int main(int, char**) {
    ifstream test_scale; 
    test_scale.open("scales/mixed.scl");
    scala::scale loaded_scale = scala::read_scl(test_scale);

    /*
       Load a scale that has both cents and ratios.
    */

    assert(loaded_scale.get_scale_length() == 3);                // Note that we add the first degree explicitly.
    assert(loaded_scale.get_ratio(0) == 1);                  // Implicit. It's always 1
    assert(loaded_scale.get_ratio(1) == pow(2.0, 1.0/6.0));  // 200 cents is the sixth root of 2 
    assert(loaded_scale.get_ratio(2) == 2);                  // Defined in scale as 2/1
    test_scale.close();
    return 0;
}